

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::DebuggerScope::AddProperty
          (DebuggerScope *this,RegSlot location,PropertyId propertyId,
          DebuggerScopePropertyFlags flags)

{
  undefined1 local_28 [8];
  DebuggerScopeProperty scopeProperty;
  
  scopeProperty.propId = -1;
  local_28._0_4_ = propertyId;
  local_28._4_4_ = location;
  scopeProperty.location = flags;
  EnsurePropertyListIsAllocated(this);
  JsUtil::
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  Add((this->scopeProperties).ptr,(DebuggerScopeProperty *)local_28);
  return;
}

Assistant:

void DebuggerScope::AddProperty(RegSlot location, Js::PropertyId propertyId, DebuggerScopePropertyFlags flags)
    {
        DebuggerScopeProperty scopeProperty;

        scopeProperty.location = location;
        scopeProperty.propId = propertyId;

        // This offset is uninitialized until the property is initialized (with a ld opcode, for example).
        scopeProperty.byteCodeInitializationOffset = Constants::InvalidByteCodeOffset;
        scopeProperty.flags = flags;

        // Delay allocate the property list so we don't take up memory if there are no properties in this scope.
        // Scopes are created during non-debug mode as well so we want to keep them as small as possible.
        this->EnsurePropertyListIsAllocated();

        // The property doesn't exist yet, so add it.
        this->scopeProperties->Add(scopeProperty);
    }